

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O2

void sh4asm_disas_inst(uint16_t inst,sh4asm_disas_emit_func em,uint32_t pc)

{
  undefined2 in_register_0000003a;
  uint rm;
  uint reg_no;
  uint quads [4];
  
  (*(code *)(&DAT_0010c040 +
            *(int *)(&DAT_0010c040 + (ulong)(CONCAT22(in_register_0000003a,inst) >> 0xc) * 4)))
            (CONCAT22(in_register_0000003a,inst),(int)em,
             &DAT_0010c040 +
             *(int *)(&DAT_0010c040 + (ulong)(CONCAT22(in_register_0000003a,inst) >> 0xc) * 4));
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_inst(uint16_t inst, sh4asm_disas_emit_func em, uint32_t pc) {
    unsigned const quads[4] = {
        inst & 0xfu,
        (inst & 0x00f0u) >> 4,
        (inst & 0x0f00u) >> 8,
        (inst & 0xf000u) >> 12
    };
    switch (quads[3]) {
    case 0:
        sh4asm_disas_0xxx_(quads, em, pc);
        break;
    case 1:
        // mask is 0xf000
        sh4asm_disas_1xxx_(quads, em, pc);
        break;
    case 2:
        // mask is 0xf00f
        sh4asm_disas_2xxx_(quads, em, pc);
        break;
    case 3:
        // mask is 0xf00f
        sh4asm_disas_3xxx_(quads, em, pc);
        break;
    case 4:
        sh4asm_disas_4xxx_(quads, em, pc);
        break;
    case 5:
        // mask is 0xf000
        sh4asm_disas_5xxx_(quads, em, pc);
        break;
    case 6:
        // mask is 0xf00f
        sh4asm_disas_6xxx_(quads, em, pc);
        break;
    case 7:
        // mask is 0xf000
        sh4asm_disas_7xxx_(quads, em, pc);
        break;
    case 8:
        // mask is 0xff00
        sh4asm_disas_8xxx_(quads, em, pc);
        break;
    case 9:
        // mask is 0xf000
        sh4asm_disas_9xxx_(quads, em, pc);
        break;
    case 10:
        // mask is 0xf000
        sh4asm_disas_axxx_(quads, em, pc);
        break;
    case 11:
        // mask is 0xf000
        sh4asm_disas_bxxx_(quads, em, pc);
        break;
    case 12:
        // mask is 0xff00
        sh4asm_disas_cxxx_(quads, em, pc);
        break;
    case 13:
        // mask is 0xf000
        sh4asm_disas_dxxx_(quads, em, pc);
        break;
    case 14:
        // mask is 0xf000
        sh4asm_disas_exxx_(quads, em, pc);
        break;
    case 15:
        // floating-point opcodes
        sh4asm_disas_fxxx_(quads, em, pc);
        break;
    default:
        goto non_inst;
    }
    return;
 non_inst:
    sh4asm_opcode_non_inst_(quads, em);
}